

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O0

NOAALRITHeader lrit::getHeader<lrit::NOAALRITHeader>(Buffer *b,HeaderMap *m)

{
  bool bVar1;
  runtime_error *this;
  NOAALRITHeader NVar2;
  const_iterator it;
  int *in_stack_00000120;
  char (*in_stack_00000128) [2];
  char (*in_stack_00000130) [89];
  char (*in_stack_00000138) [37];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff88;
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  Buffer *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (in_stack_ffffffffffffff88,(key_type *)0x16b5bf);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (in_stack_ffffffffffffff88);
  bVar1 = std::operator!=(local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x16b6b4);
    NVar2 = getHeader<lrit::NOAALRITHeader>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    return NVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[37],char[89],char[2],int>
            (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
  std::runtime_error::runtime_error(this,local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}